

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

Span * __thiscall tcmalloc::PageHeap::AllocLarge(PageHeap *this,Length n)

{
  bool bVar1;
  iterator iVar2;
  Span *pSVar3;
  Span *span;
  Span local_68;
  key_type local_38;
  
  local_68.start = 0;
  local_68.field_4._0_4_ = 0;
  local_68._36_8_ = 0;
  local_68.next = (Span *)0x0;
  local_68.prev._0_4_ = 0;
  local_68.prev._4_4_ = 0;
  local_68.length = n;
  local_38.span = &local_68;
  local_38.length = n;
  iVar2 = std::
          _Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
          ::upper_bound(&(this->large_normal_)._M_t,&local_38);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header)
  {
    pSVar3 = (Span *)0x0;
  }
  else {
    pSVar3 = *(Span **)(iVar2._M_node + 1);
  }
  local_38.length = local_68.length;
  local_38.span = &local_68;
  iVar2 = std::
          _Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
          ::upper_bound(&(this->large_returned_)._M_t,&local_38);
  span = pSVar3;
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header) {
    span = *(Span **)(iVar2._M_node + 1);
    if (((pSVar3 != (Span *)0x0) && (pSVar3->length <= span->length)) &&
       ((span->length != pSVar3->length || (pSVar3->start <= span->start)))) goto LAB_0011d91a;
    if (span != pSVar3) {
      bVar1 = EnsureLimit(this,n,false);
      if (bVar1) {
        Carve(this,span,n);
        return span;
      }
      bVar1 = EnsureLimit(this,n,true);
      if (!bVar1) {
        return (Span *)0x0;
      }
      pSVar3 = AllocLarge(this,n);
      return pSVar3;
    }
  }
  pSVar3 = span;
  if (span == (Span *)0x0) {
    return (Span *)0x0;
  }
LAB_0011d91a:
  Carve(this,pSVar3,n);
  return pSVar3;
}

Assistant:

Span* PageHeap::AllocLarge(Length n) {
  ASSERT(lock_.IsHeld());
  Span *best = nullptr;
  Span *best_normal = nullptr;

  // Create a Span to use as an upper bound.
  Span bound;
  bound.start = 0;
  bound.length = n;

  // First search the NORMAL spans..
  SpanSetIter place = large_normal_.upper_bound(SpanPtrWithLength(&bound));
  if (place != large_normal_.end()) {
    best = place->span;
    best_normal = best;
    ASSERT(best->location == Span::ON_NORMAL_FREELIST);
  }

  // Try to find better fit from RETURNED spans.
  place = large_returned_.upper_bound(SpanPtrWithLength(&bound));
  if (place != large_returned_.end()) {
    Span *c = place->span;
    ASSERT(c->location == Span::ON_RETURNED_FREELIST);
    if (best_normal == nullptr
        || c->length < best->length
        || (c->length == best->length && c->start < best->start))
      best = place->span;
  }

  if (best == best_normal) {
    return best == nullptr ? nullptr : Carve(best, n);
  }

  // best comes from RETURNED set.

  if (EnsureLimit(n, false)) {
    return Carve(best, n);
  }

  if (EnsureLimit(n, true)) {
    // best could have been destroyed by coalescing.
    // best_normal is not a best-fit, and it could be destroyed as well.
    // We retry, the limit is already ensured:
    return AllocLarge(n);
  }

  // If best_normal existed, EnsureLimit would succeeded:
  ASSERT(best_normal == nullptr);
  // We are not allowed to take best from returned list.
  return nullptr;
}